

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::CopyImage::FunctionalTest::FunctionalTest(FunctionalTest *this,Context *context)

{
  GLenum target;
  GLenum target_00;
  GLenum src;
  GLenum dst;
  bool bVar1;
  uint local_34;
  GLenum dst_format;
  GLuint dst_frmt_id;
  GLenum src_format;
  GLuint src_frmt_id;
  GLenum dst_target;
  GLuint dst_tgt_id;
  GLenum src_target;
  GLuint src_tgt_id;
  Context *context_local;
  FunctionalTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"functional",
             "Test verifies CopySubImageData copy data as requested");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FunctionalTest_0322e570;
  this->m_dst_buf_name = 0;
  this->m_dst_tex_name = 0;
  this->m_rb_name = 0;
  this->m_src_buf_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  std::
  vector<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
  ::vector(&this->m_test_cases);
  for (dst_tgt_id = 0; dst_tgt_id < 0xb; dst_tgt_id = dst_tgt_id + 1) {
    target = *(GLenum *)(s_valid_targets + (ulong)dst_tgt_id * 4);
    if ((((target != 0xde0) && (target != 0x8c18)) && (target != 0xde1)) &&
       ((target != 0x8513 && (target != 0x9009)))) {
      for (src_frmt_id = 0; src_frmt_id < 0xb; src_frmt_id = src_frmt_id + 1) {
        target_00 = *(GLenum *)(s_valid_targets + (ulong)src_frmt_id * 4);
        if ((((target_00 != 0xde0) && (target_00 != 0x8c18)) &&
            ((target_00 != 0xde1 &&
             (((target_00 != 0x8513 && (target_00 != 0x9009)) && (target_00 != 0x8d41)))))) &&
           ((bVar1 = Utils::isTargetMultisampled(target), !bVar1 &&
            (bVar1 = Utils::isTargetMultisampled(target_00), !bVar1)))) {
          for (dst_frmt_id = 0; dst_frmt_id < 0x3d; dst_frmt_id = dst_frmt_id + 1) {
            src = *(GLenum *)(s_internal_formats + (ulong)dst_frmt_id * 4);
            if ((src != 0x8c3d) || (target != 0x8d41)) {
              for (local_34 = 0; local_34 < 0x3d; local_34 = local_34 + 1) {
                dst = *(GLenum *)(s_internal_formats + (ulong)local_34 * 4);
                bVar1 = Utils::areFormatsCompatible(src,dst);
                if (bVar1) {
                  prepareTestCases(this,dst,target_00,src,target);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

FunctionalTest::FunctionalTest(deqp::Context& context)
	: TestCase(context, "functional", "Test verifies CopySubImageData copy data as requested")
	, m_dst_buf_name(0)
	, m_dst_tex_name(0)
	, m_rb_name(0)
	, m_src_buf_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	for (GLuint src_tgt_id = 0; src_tgt_id < s_n_valid_targets; ++src_tgt_id)
	{
		const GLenum src_target = s_valid_targets[src_tgt_id];

#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_TARGETS == 0
		if ((GL_TEXTURE_1D == src_target) || (GL_TEXTURE_1D_ARRAY == src_target) || (GL_TEXTURE_2D == src_target) ||
			(GL_TEXTURE_CUBE_MAP == src_target) || (GL_TEXTURE_CUBE_MAP_ARRAY == src_target))
		{
			continue;
		}
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_TARGETS == 0 */

		for (GLuint dst_tgt_id = 0; dst_tgt_id < s_n_valid_targets; ++dst_tgt_id)
		{
			const GLenum dst_target = s_valid_targets[dst_tgt_id];

#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_TARGETS == 0
			if ((GL_TEXTURE_1D == dst_target) || (GL_TEXTURE_1D_ARRAY == dst_target) || (GL_TEXTURE_2D == dst_target) ||
				(GL_TEXTURE_CUBE_MAP == dst_target) || (GL_TEXTURE_CUBE_MAP_ARRAY == dst_target))
			{
				continue;
			}
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_TARGETS == 0 */

			/* Skip render buffer as destination */
			if (GL_RENDERBUFFER == dst_target)
			{
				continue;
			}

			/* Skip multisampled */
			if ((true == Utils::isTargetMultisampled(src_target)) || (true == Utils::isTargetMultisampled(dst_target)))
			{
				continue;
			}

			for (GLuint src_frmt_id = 0; src_frmt_id < s_n_internal_formats; ++src_frmt_id)
			{
				const GLenum src_format = s_internal_formats[src_frmt_id];

				if (src_format == GL_RGB9_E5 && src_target == GL_RENDERBUFFER)
				{
					continue;
				}

				for (GLuint dst_frmt_id = 0; dst_frmt_id < s_n_internal_formats; ++dst_frmt_id)
				{
					const GLenum dst_format = s_internal_formats[dst_frmt_id];

					/* Skip not compatible formats */
					if (false == Utils::areFormatsCompatible(src_format, dst_format))
					{
						continue;
					}

					prepareTestCases(dst_format, dst_target, src_format, src_target);
				}
			}
		}
	}
}